

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::UnknownFieldSet::SerializeToCord(UnknownFieldSet *this,Cord *output)

{
  CordRep *pCVar1;
  bool bVar2;
  size_t size_hint;
  uint8_t *ptr;
  void *data;
  CodedOutputStream coded_output_stream;
  CordOutputStream cord_output_stream;
  uint local_c4;
  CordRep *local_c0;
  undefined1 local_b8 [16];
  CordRep local_a8 [2];
  undefined8 local_88;
  undefined2 local_80;
  bool local_7e;
  bool local_7d;
  CordRep *local_78;
  int64_t local_70;
  CordOutputStream local_60;
  
  size_hint = internal::WireFormat::ComputeUnknownFieldsSize(this);
  io::CordOutputStream::CordOutputStream(&local_60,size_hint);
  local_7e = (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
  local_80._0_1_ = false;
  local_80._1_1_ = false;
  local_7d = false;
  local_b8._0_8_ = local_a8;
  local_b8._8_8_ = local_a8;
  local_88 = &local_60;
  local_78 = local_a8;
  local_70 = io::CordOutputStream::ByteCount(&local_60);
  bVar2 = io::CordOutputStream::Next(&local_60,&local_c0,(int *)&local_c4);
  if (bVar2 && 0 < (int)local_c4) {
    pCVar1 = local_c0 + -1;
    if (local_c4 < 0x11) {
      pCVar1 = local_a8;
    }
    local_b8._0_8_ = pCVar1->storage + ((ulong)local_c4 - 0xd);
    local_b8._8_8_ = local_c0;
    local_78 = local_a8;
    if (local_c4 >= 0x11) {
      local_b8._8_8_ = (CordRep *)0x0;
      local_78 = local_c0;
    }
  }
  local_78 = (CordRep *)
             internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       (this,(uint8_t *)local_78,(EpsCopyOutputStream *)local_b8);
  bVar2 = io::CodedOutputStream::HadError((CodedOutputStream *)local_b8);
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_b8);
  if (!bVar2) {
    io::CordOutputStream::Consume((CordOutputStream *)local_b8);
    if (((output->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
      absl::lts_20250127::Cord::InlineRep::UnrefTree(&output->contents_);
    }
    (output->contents_).data_.rep_.field_0.as_tree.cordz_info = local_b8._0_8_;
    (output->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)local_b8._8_8_;
    local_b8._0_8_ = (CordRep *)0x0;
    local_b8._8_8_ = (CordRep *)0x0;
    absl::lts_20250127::Cord::~Cord((Cord *)local_b8);
  }
  if ((local_60.buffer_.rep_.field_0.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)
               CONCAT71(local_60.buffer_.rep_.field_0._1_7_,
                        local_60.buffer_.rep_.field_0.short_rep.raw_size));
  }
  absl::lts_20250127::Cord::~Cord(&local_60.cord_);
  return !bVar2;
}

Assistant:

bool UnknownFieldSet::SerializeToCord(absl::Cord* output) const {
  const size_t size =
      google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(*this);
  io::CordOutputStream cord_output_stream(size);
  {
    io::CodedOutputStream coded_output_stream(&cord_output_stream);
    if (!SerializeToCodedStream(&coded_output_stream)) return false;
  }
  *output = cord_output_stream.Consume();
  return true;
}